

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O0

QueryResult *
QueryResult::do_min_of_real
          (int cutoff,vector<QueryResult_*,_std::allocator<QueryResult_*>_> *sources)

{
  QueryResult *this;
  bool bVar1;
  reference ppQVar2;
  size_type sVar3;
  reference ppSVar4;
  ulong uVar5;
  void *__child_stack;
  void *__child_stack_00;
  int in_ESI;
  QueryResult *in_RDI;
  void *in_R8;
  int i_1;
  int i;
  QueryResult *source;
  iterator __end1;
  iterator __begin1;
  vector<QueryResult_*,_std::allocator<QueryResult_*>_> *__range1;
  vector<SortedRun_*,_std::allocator<SortedRun_*>_> nontrivial_sources;
  QueryResult *out;
  SortedRun *in_stack_fffffffffffffeb8;
  QueryResult *in_stack_fffffffffffffec0;
  SortedRun *in_stack_fffffffffffffed0;
  int local_dc;
  SortedRun *in_stack_ffffffffffffff48;
  SortedRun *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar6;
  SortedRun *in_stack_ffffffffffffff60;
  __normal_iterator<QueryResult_**,_std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>_>
  local_40 [2];
  vector<SortedRun_*,_std::allocator<SortedRun_*>_> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  int local_c;
  
  std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::vector
            ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)0x200708);
  local_40[0]._M_current =
       (QueryResult **)
       std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>::begin
                 ((vector<QueryResult_*,_std::allocator<QueryResult_*>_> *)in_stack_fffffffffffffeb8
                 );
  std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>::end
            ((vector<QueryResult_*,_std::allocator<QueryResult_*>_> *)in_stack_fffffffffffffeb8);
  local_c = in_ESI;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<QueryResult_**,_std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<QueryResult_**,_std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>_>
                             *)in_stack_fffffffffffffeb8), bVar1) {
    ppQVar2 = __gnu_cxx::
              __normal_iterator<QueryResult_**,_std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>_>
              ::operator*(local_40);
    this = *ppQVar2;
    bVar1 = is_everything(this);
    if (bVar1) {
      local_c = local_c + -1;
    }
    else {
      bVar1 = is_empty(in_stack_fffffffffffffec0);
      if (!bVar1) {
        in_stack_fffffffffffffed0 = vector(this);
        std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::push_back
                  ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)in_stack_fffffffffffffec0,
                   (value_type *)in_stack_fffffffffffffeb8);
      }
    }
    __gnu_cxx::
    __normal_iterator<QueryResult_**,_std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>_>::
    operator++(local_40);
  }
  if (local_c < 1) {
    everything();
  }
  else {
    sVar3 = std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::size
                      ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)&stack0xffffffffffffffd0
                      );
    if ((int)sVar3 < local_c) {
      empty();
    }
    else {
      sVar3 = std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::size
                        ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)
                         &stack0xffffffffffffffd0);
      iVar6 = (int)sVar3;
      if (local_c == iVar6) {
        ppSVar4 = std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::operator[]
                            ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)
                             &stack0xffffffffffffffd0,0);
        SortedRun::clone((SortedRun *)&stack0xffffffffffffff60,(__fn *)*ppSVar4,__child_stack,iVar6,
                         in_R8);
        QueryResult(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        SortedRun::~SortedRun(&in_stack_fffffffffffffec0->results);
        iVar6 = 1;
        while( true ) {
          uVar5 = (ulong)iVar6;
          sVar3 = std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::size
                            ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)
                             &stack0xffffffffffffffd0);
          if (sVar3 <= uVar5) break;
          std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::operator[]
                    ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)&stack0xffffffffffffffd0,
                     (long)iVar6);
          SortedRun::do_and(in_stack_ffffffffffffff60,
                            (SortedRun *)CONCAT44(iVar6,in_stack_ffffffffffffff58));
          iVar6 = iVar6 + 1;
        }
      }
      else if (local_c == 1) {
        ppSVar4 = std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::operator[]
                            ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)
                             &stack0xffffffffffffffd0,0);
        SortedRun::clone((SortedRun *)&stack0xffffffffffffff28,(__fn *)*ppSVar4,__child_stack_00,
                         iVar6,in_R8);
        QueryResult(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        SortedRun::~SortedRun(&in_stack_fffffffffffffec0->results);
        local_dc = 1;
        while( true ) {
          uVar5 = (ulong)local_dc;
          sVar3 = std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::size
                            ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)
                             &stack0xffffffffffffffd0);
          if (sVar3 <= uVar5) break;
          std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::operator[]
                    ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)&stack0xffffffffffffffd0,
                     (long)local_dc);
          SortedRun::do_or(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          local_dc = local_dc + 1;
        }
      }
      else {
        SortedRun::pick_common(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
        QueryResult(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        SortedRun::~SortedRun(&in_stack_fffffffffffffec0->results);
      }
    }
  }
  std::vector<SortedRun_*,_std::allocator<SortedRun_*>_>::~vector
            ((vector<SortedRun_*,_std::allocator<SortedRun_*>_> *)in_stack_fffffffffffffed0);
  return in_RDI;
}

Assistant:

QueryResult QueryResult::do_min_of_real(int cutoff,
                                        std::vector<QueryResult *> &sources) {
    std::vector<SortedRun *> nontrivial_sources;
    for (QueryResult *source : sources) {
        if (source->is_everything()) {
            cutoff -= 1;
        } else if (!source->is_empty()) {
            nontrivial_sources.push_back(&source->vector());
        }
    }

    // '0 of (...)' should match everything.
    if (cutoff <= 0) {
        return QueryResult::everything();
    }

    // Short circuit when cutoff is too big.
    // This may happen when there are empty results in sources.
    if (cutoff > static_cast<int>(nontrivial_sources.size())) {
        return QueryResult::empty();
    }

    // Special case optimisation - reduction to AND.
    if (cutoff == static_cast<int>(nontrivial_sources.size())) {
        QueryResult out{nontrivial_sources[0]->clone()};
        for (int i = 1; i < nontrivial_sources.size(); i++) {
            out.results.do_and(*nontrivial_sources[i]);
        }
        return out;
    }

    // Special case optimisation - reduction to OR.
    if (cutoff == 1) {
        QueryResult out{nontrivial_sources[0]->clone()};
        for (int i = 1; i < nontrivial_sources.size(); i++) {
            out.results.do_or(*nontrivial_sources[i]);
        }
        return out;
    }

    return QueryResult(SortedRun::pick_common(cutoff, nontrivial_sources));
}